

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocating_handler.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::
handler_allocator<boost::asio::detail::executor_op<libtorrent::aux::allocating_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:1372:4),_72UL,_(libtorrent::aux::HandlerName)7>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)7>,_boost::asio::detail::scheduler_operation>,_72UL,_(libtorrent::aux::HandlerName)7>
::deallocate(handler_allocator<boost::asio::detail::executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1372:4),_72UL,_(libtorrent::aux::HandlerName)7>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)7>,_boost::asio::detail::scheduler_operation>,_72UL,_(libtorrent::aux::HandlerName)7>
             *this,executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1372:4),_72UL,_(libtorrent::aux::HandlerName)7>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)7>,_boost::asio::detail::scheduler_operation>
                   *ptr,size_t size)

{
  size_t size_local;
  executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1372:4),_72UL,_(libtorrent::aux::HandlerName)7>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)7>,_boost::asio::detail::scheduler_operation>
  *ptr_local;
  handler_allocator<boost::asio::detail::executor_op<libtorrent::aux::allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:1372:4),_72UL,_(libtorrent::aux::HandlerName)7>,_libtorrent::aux::handler_allocator<int,_72UL,_(libtorrent::aux::HandlerName)7>,_boost::asio::detail::scheduler_operation>,_72UL,_(libtorrent::aux::HandlerName)7>
  *this_local;
  
  return;
}

Assistant:

void deallocate(T* ptr, std::size_t size)
		{
			TORRENT_UNUSED(ptr);
			TORRENT_UNUSED(size);

			TORRENT_ASSERT_VAL(size == 1, size);
			TORRENT_ASSERT_VAL(sizeof(T) <= Size, sizeof(T));
			TORRENT_ASSERT(ptr == reinterpret_cast<T*>(m_storage->bytes.data()));
			TORRENT_ASSERT(m_storage->used);
#if TORRENT_USE_ASSERTS
			m_storage->used = false;
#endif
		}